

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.h
# Opt level: O1

void __thiscall HighsLp::HighsLp(HighsLp *this)

{
  (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HighsSparseMatrix::HighsSparseMatrix(&this->a_matrix_);
  (this->model_name_)._M_dataplus._M_p = (pointer)&(this->model_name_).field_2;
  (this->model_name_)._M_string_length = 0;
  (this->model_name_).field_2._M_local_buf[0] = '\0';
  (this->objective_name_)._M_dataplus._M_p = (pointer)&(this->objective_name_).field_2;
  (this->objective_name_)._M_string_length = 0;
  (this->objective_name_).field_2._M_local_buf[0] = '\0';
  this->new_col_name_ix_ = 0;
  this->new_row_name_ix_ = 0;
  (this->col_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->col_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->col_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->col_hash_).name2index._M_h._M_buckets = &(this->col_hash_).name2index._M_h._M_single_bucket
  ;
  (this->col_hash_).name2index._M_h._M_bucket_count = 1;
  (this->col_hash_).name2index._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->col_hash_).name2index._M_h._M_element_count = 0;
  (this->col_hash_).name2index._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->col_hash_).name2index._M_h._M_rehash_policy._M_next_resize = 0;
  (this->col_hash_).name2index._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->row_hash_).name2index._M_h._M_buckets = &(this->row_hash_).name2index._M_h._M_single_bucket
  ;
  (this->row_hash_).name2index._M_h._M_bucket_count = 1;
  (this->row_hash_).name2index._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->row_hash_).name2index._M_h._M_element_count = 0;
  (this->row_hash_).name2index._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->row_hash_).name2index._M_h._M_rehash_policy._M_next_resize = 0;
  (this->row_hash_).name2index._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  memset(&this->mods_,0,0x138);
  clear(this);
  return;
}

Assistant:

HighsLp() { clear(); }